

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O3

bool __thiscall
t_php_generator::needs_php_write_validator(t_php_generator *this,t_struct *tstruct,bool is_result)

{
  pointer pptVar1;
  int iVar2;
  const_iterator f_iter;
  pointer pptVar3;
  
  if ((this->validate_ == true && !is_result) && (tstruct->is_union_ == false)) {
    pptVar3 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pptVar1 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    iVar2 = 0;
    if (pptVar1 != pptVar3) {
      do {
        iVar2 = iVar2 + (uint)(((*pptVar3)->req_ & ~T_OPT_IN_REQ_OUT) == T_REQUIRED);
        pptVar3 = pptVar3 + 1;
      } while (pptVar3 != pptVar1);
      return iVar2 != 0;
    }
  }
  return false;
}

Assistant:

bool t_php_generator::needs_php_write_validator(t_struct* tstruct, bool is_result) {
  return (validate_ && !is_result && !tstruct->is_union()
          && get_php_num_required_fields(tstruct->get_members(), true) > 0);
}